

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
          (Incomplete2DWrapModeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,deUint32 wrapT,deUint32 wrapS,ContextInfo *ctxInfo)

{
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_Tex2DCompletenessCase).m_testCtx = testCtx;
  (this->super_Tex2DCompletenessCase).m_renderCtx = renderCtx;
  (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xff000000;
  (this->super_Tex2DCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02120610;
  *(deUint32 *)&(this->super_Tex2DCompletenessCase).field_0x84 = wrapT;
  this->m_wrapS = wrapS;
  this->m_ctxInfo = ctxInfo;
  (this->m_size).m_data[0] = size->m_data[0];
  (this->m_size).m_data[1] = size->m_data[1];
  return;
}

Assistant:

Incomplete2DWrapModeCase::Incomplete2DWrapModeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, deUint32 wrapT, deUint32 wrapS, const glu::ContextInfo& ctxInfo)
	: Tex2DCompletenessCase		(testCtx, renderCtx, name, description)
	, m_wrapT					(wrapT)
	, m_wrapS					(wrapS)
	, m_ctxInfo					(ctxInfo)
	, m_size					(size)
{
}